

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsNODE::to_str(gdsNODE *this)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_14;
  uint i;
  gdsNODE *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"GDS NODE class:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  layer: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->layer);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  nodetype: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->nodetype);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  propattr: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->propattr);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  propvalue: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->propvalue);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"  xCor:\tyCor:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_14 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->xCor);
    if (sVar3 <= local_14) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->xCor,(ulong)local_14);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
    poVar1 = std::operator<<(poVar1,"\t");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->xCor,(ulong)local_14);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*pvVar4);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void gdsNODE::to_str()
{
  cout << "GDS NODE class:" << endl;

  cout << "  layer: " << this->layer << endl;
  cout << "  nodetype: " << this->nodetype << endl;
  cout << "  propattr: " << this->propattr << endl;
  cout << "  propvalue: " << this->propvalue << endl;

  cout << "  xCor:\tyCor:" << endl;
  for (unsigned int i = 0; i < this->xCor.size(); i++) {
    cout << this->xCor[i] << "\t" << this->xCor[i] << endl;
  }
}